

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  int lhs;
  bool bVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  bool local_7f;
  int local_78;
  bool local_72;
  bool local_71;
  float v_cur_norm_curved;
  float v_new_norm_curved;
  float v_old_norm_curved;
  float v_old_ref_for_accum_remainder;
  int v_cur;
  bool is_drag_direction_change_with_power;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int local_50;
  float local_4c;
  int decimal_precision;
  float adjust_delta;
  bool is_locked;
  bool is_power;
  bool is_clamped;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  ImGuiDragFlags flags_local;
  float power_local;
  char *format_local;
  float local_20;
  int v_max_local;
  int v_min_local;
  float v_speed_local;
  int *v_local;
  ImGuiDataType data_type_local;
  
  _is_locked = GImGui;
  adjust_delta = (float)(uint)((flags & 1U) != 0);
  local_71 = data_type == 8 || data_type == 9;
  decimal_precision._3_1_ = local_71;
  decimal_precision._2_1_ = v_min < v_max;
  local_72 = false;
  if ((((power != 1.0) || (NAN(power))) && (local_72 = false, data_type == 8 || data_type == 9)) &&
     (local_72 = false, (bool)decimal_precision._2_1_)) {
    local_72 = (float)(v_max - v_min) < 3.4028235e+38;
  }
  decimal_precision._1_1_ = local_72;
  decimal_precision._0_1_ = v_max < v_min;
  if ((bool)(undefined1)decimal_precision) {
    v_local._7_1_ = false;
  }
  else {
    v_max_local = (int)v_speed;
    if (((v_speed == 0.0) && (!NAN(v_speed))) &&
       (((bool)decimal_precision._2_1_ && ((float)(v_max - v_min) < 3.4028235e+38)))) {
      v_max_local = (int)((float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio);
    }
    local_4c = 0.0;
    g._0_4_ = flags;
    g._4_4_ = power;
    _flags_local = format;
    format_local._4_4_ = (float)v_max;
    local_20 = (float)v_min;
    _v_min_local = (float *)v;
    v_local._0_4_ = data_type;
    if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
        (bVar1 = IsMousePosValid((ImVec2 *)0x0), !bVar1)) ||
       ((_is_locked->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      if (_is_locked->ActiveIdSource == ImGuiInputSource_Nav) {
        if ((decimal_precision._3_1_ & 1) == 0) {
          local_78 = 0;
        }
        else {
          local_78 = ImParseFormatPrecision(_flags_local,3);
        }
        local_50 = local_78;
        _v_cur = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
        pfVar2 = ImVec2::operator[]((ImVec2 *)&v_cur,(long)(int)adjust_delta);
        lhs = v_max_local;
        local_4c = *pfVar2;
        fVar3 = GetMinimumStepAtDecimalPrecision(local_50);
        v_max_local = (int)ImMax<float>((float)lhs,fVar3);
      }
    }
    else {
      pfVar2 = ImVec2::operator[](&(_is_locked->IO).MouseDelta,(long)(int)adjust_delta);
      local_4c = *pfVar2;
      if (((_is_locked->IO).KeyAlt & 1U) != 0) {
        local_4c = local_4c * 0.01;
      }
      if (((_is_locked->IO).KeyShift & 1U) != 0) {
        local_4c = local_4c * 10.0;
      }
    }
    local_4c = (float)v_max_local * local_4c;
    if (adjust_delta == 1.4013e-45) {
      local_4c = -local_4c;
    }
    local_7f = false;
    if (((decimal_precision._2_1_ & 1) != 0) &&
       (((int)*_v_min_local < (int)format_local._4_4_ || (local_7f = true, local_4c <= 0.0)))) {
      local_7f = (int)*_v_min_local <= (int)local_20 && local_4c < 0.0;
    }
    bVar1 = false;
    if (((decimal_precision._1_1_ & 1) != 0) &&
       (((0.0 <= local_4c || (bVar1 = true, _is_locked->DragCurrentAccum <= 0.0)) &&
        (bVar1 = false, 0.0 < local_4c)))) {
      bVar1 = _is_locked->DragCurrentAccum <= 0.0 && _is_locked->DragCurrentAccum != 0.0;
    }
    if ((((_is_locked->ActiveIdIsJustActivated & 1U) != 0) || (local_7f)) || (bVar1)) {
      _is_locked->DragCurrentAccum = 0.0;
      _is_locked->DragCurrentAccumDirty = false;
    }
    else if ((local_4c != 0.0) || (NAN(local_4c))) {
      _is_locked->DragCurrentAccum = local_4c + _is_locked->DragCurrentAccum;
      _is_locked->DragCurrentAccumDirty = true;
    }
    if ((_is_locked->DragCurrentAccumDirty & 1U) == 0) {
      v_local._7_1_ = false;
    }
    else {
      v_new_norm_curved = 0.0;
      if ((decimal_precision._1_1_ & 1) == 0) {
        v_old_norm_curved = (float)((int)_is_locked->DragCurrentAccum + (int)*_v_min_local);
      }
      else {
        v_new_norm_curved =
             ImPow((float)((int)*_v_min_local - (int)local_20) /
                   (float)((int)format_local._4_4_ - (int)local_20),1.0 / g._4_4_);
        fVar3 = local_20;
        fVar4 = ImSaturate(v_new_norm_curved +
                           _is_locked->DragCurrentAccum /
                           (float)((int)format_local._4_4_ - (int)local_20));
        fVar4 = ImPow(fVar4,g._4_4_);
        v_old_norm_curved =
             (float)((int)fVar3 + (int)fVar4 * ((int)format_local._4_4_ - (int)local_20));
      }
      v_old_norm_curved =
           (float)RoundScalarWithFormatT<int,int>
                            (_flags_local,(ImGuiDataType)v_local,(int)v_old_norm_curved);
      _is_locked->DragCurrentAccumDirty = false;
      if ((decimal_precision._1_1_ & 1) == 0) {
        _is_locked->DragCurrentAccum =
             _is_locked->DragCurrentAccum - (float)((int)v_old_norm_curved - (int)*_v_min_local);
      }
      else {
        fVar3 = ImPow((float)((int)v_old_norm_curved - (int)local_20) /
                      (float)((int)format_local._4_4_ - (int)local_20),1.0 / g._4_4_);
        _is_locked->DragCurrentAccum = _is_locked->DragCurrentAccum - (fVar3 - v_new_norm_curved);
      }
      if (v_old_norm_curved == 0.0) {
        v_old_norm_curved = 0.0;
      }
      if ((*_v_min_local != v_old_norm_curved) && ((decimal_precision._2_1_ & 1) != 0)) {
        if (((int)v_old_norm_curved < (int)local_20) ||
           ((((int)*_v_min_local < (int)v_old_norm_curved && (local_4c < 0.0)) &&
            ((decimal_precision._3_1_ & 1) == 0)))) {
          v_old_norm_curved = local_20;
        }
        if (((int)format_local._4_4_ < (int)v_old_norm_curved) ||
           ((((int)v_old_norm_curved < (int)*_v_min_local && (0.0 < local_4c)) &&
            ((decimal_precision._3_1_ & 1) == 0)))) {
          v_old_norm_curved = format_local._4_4_;
        }
      }
      if (*_v_min_local == v_old_norm_curved) {
        v_local._7_1_ = false;
      }
      else {
        *_v_min_local = v_old_norm_curved;
        v_local._7_1_ = true;
      }
    }
  }
  return v_local._7_1_;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}